

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cygwin.cpp
# Opt level: O1

string * fs_to_cygpath_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view fname;
  
  fname._M_str = "fs_convert_path";
  fname._M_len = 0xf;
  fs_print_error(path,fname);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_to_cygpath(std::string_view path) {
  return fs_convert_path(path, CCP_WIN_A_TO_POSIX);
}